

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void add_block(storage *st,string *data)

{
  uint64_t uVar1;
  undefined1 auStack_188 [8];
  block last;
  uint64_t uStack_110;
  char *local_108 [2];
  char local_f8 [16];
  char *local_e8 [2];
  char local_d8 [16];
  char *local_c8 [2];
  char local_b8 [16];
  undefined1 local_a8 [16];
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  uint64_t local_38;
  uint64_t num;
  
  local_a8._0_8_ = 0;
  local_a8._8_8_ = 0;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_58._M_p = (pointer)&local_48;
  local_50 = 0;
  local_48._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
  uVar1 = storage::fsize(st);
  if (uVar1 == 0) {
    last.sha256.field_2._8_8_ = local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&last.sha256.field_2 + 8),"");
    new_block((block *)auStack_188,(string *)((long)&last.sha256.field_2 + 8),0,
              (data->_M_dataplus)._M_p,data->_M_string_length);
    local_a8._0_8_ = auStack_188;
    local_a8._8_8_ = last.idx;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&last.timestamp);
    std::__cxx11::string::operator=
              ((string *)&local_78,(string *)(last.prevsha256.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)&local_58,(string *)(last.data.field_2._M_local_buf + 8));
    if ((size_type *)last.data.field_2._8_8_ != &last.sha256._M_string_length) {
      operator_delete((void *)last.data.field_2._8_8_);
    }
    if ((size_type *)last.prevsha256.field_2._8_8_ != &last.data._M_string_length) {
      operator_delete((void *)last.prevsha256.field_2._8_8_);
    }
    if ((size_type *)last.timestamp != &last.prevsha256._M_string_length) {
      operator_delete((void *)last.timestamp);
    }
    if ((char **)last.sha256.field_2._8_8_ != local_108) {
      operator_delete((void *)last.sha256.field_2._8_8_);
    }
    storage::write_block(st,(block *)local_a8);
  }
  else {
    local_38 = 0;
    storage::last_block((block *)auStack_188,st,&local_38);
    new_block((block *)((long)&last.sha256.field_2 + 8),(string *)((long)&last.data.field_2 + 8),
              local_38,(data->_M_dataplus)._M_p,data->_M_string_length);
    local_a8._0_8_ = last.sha256.field_2._8_8_;
    local_a8._8_8_ = uStack_110;
    std::__cxx11::string::operator=((string *)&local_98,(string *)local_108);
    std::__cxx11::string::operator=((string *)&local_78,(string *)local_e8);
    std::__cxx11::string::operator=((string *)&local_58,(string *)local_c8);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0]);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0]);
    }
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0]);
    }
    storage::write_block(st,(block *)local_a8);
    if ((size_type *)last.data.field_2._8_8_ != &last.sha256._M_string_length) {
      operator_delete((void *)last.data.field_2._8_8_);
    }
    if ((size_type *)last.prevsha256.field_2._8_8_ != &last.data._M_string_length) {
      operator_delete((void *)last.prevsha256.field_2._8_8_);
    }
    if ((size_type *)last.timestamp != &last.prevsha256._M_string_length) {
      operator_delete((void *)last.timestamp);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_p != &local_48) {
    operator_delete(local_58._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p);
  }
  return;
}

Assistant:

void add_block(storage &st, const std::string &data) {
    block b{};
    if ( st.empty() ) {
        b = new_block("", 0, data.data(), data.size());
        st.add(b);
    } else {
        std::uint64_t num{};
        block last = st.last_block(&num);
        b = new_block(last.sha256, num, data.data(), data.size());
        st.add(b);
    }
}